

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * __thiscall
ON_Font::Internal_DecoratedFont(ON_Font *this,bool bUnderlined,bool bStrikethrough)

{
  bool bVar1;
  ON_Font *pOVar2;
  ON_Font *local_128;
  ON_Font *decorated_font;
  undefined1 local_e0 [8];
  ON_Font decorated;
  bool bStrikethrough_local;
  bool bUnderlined_local;
  ON_Font *this_local;
  
  this_local = this;
  if ((bUnderlined) || (bStrikethrough)) {
    decorated.m_managed_installed_font_and_bits._6_1_ = bStrikethrough;
    decorated.m_managed_installed_font_and_bits._7_1_ = bUnderlined;
    if (bUnderlined) {
      bVar1 = false;
    }
    else {
      bVar1 = IsUnderlined(this);
      if (bVar1) {
        bVar1 = false;
      }
      else if ((decorated.m_managed_installed_font_and_bits._6_1_ & 1) == 0) {
        bVar1 = IsStrikethrough(this);
        bVar1 = !bVar1;
      }
      else {
        bVar1 = false;
      }
    }
    if (!bVar1) {
      ON_Font((ON_Font *)local_e0,this);
      SetUnderlined((ON_Font *)local_e0,
                    (bool)(decorated.m_managed_installed_font_and_bits._7_1_ & 1));
      SetStrikethrough((ON_Font *)local_e0,
                       (bool)(decorated.m_managed_installed_font_and_bits._6_1_ & 1));
      pOVar2 = ManagedFont((ON_Font *)local_e0);
      if ((pOVar2 != (ON_Font *)0x0) && (pOVar2->m_quartet_member == Unset)) {
        pOVar2->m_quartet_member = this->m_quartet_member;
      }
      local_128 = this;
      if (pOVar2 != (ON_Font *)0x0) {
        local_128 = pOVar2;
      }
      this_local = local_128;
      ~ON_Font((ON_Font *)local_e0);
    }
  }
  return this_local;
}

Assistant:

const ON_Font* ON_Font::Internal_DecoratedFont(
  bool bUnderlined,
  bool bStrikethrough
) const
{
  // Underline and strikethrough are font rendering effects and are not  designed into the font glyphs.
  if (false == bUnderlined && false == bStrikethrough)
    return this;

  if (bUnderlined ? 0 : 1 == this->IsUnderlined() ? 0 : 1 && bStrikethrough ? 0 : 1 == this->IsStrikethrough() ? 0 : 1)
    return this;

  ON_Font decorated(*this);
  decorated.SetUnderlined(bUnderlined);
  decorated.SetStrikethrough(bStrikethrough);
  const ON_Font* decorated_font = decorated.ManagedFont();
  if (nullptr != decorated_font && ON_FontFaceQuartet::Member::Unset == decorated_font->m_quartet_member)
  {
    // Decorated faces are not explicitly in quartets,
    // but when dealing with rich text, we need to know what quartet member they are decorating.
    decorated_font->m_quartet_member = this->m_quartet_member;
  }

  return (nullptr != decorated_font) ? decorated_font : this;
}